

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::RawMatrix::setIdentity(RawMatrix *dst)

{
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  *(undefined8 *)&(dst->pos).z = 0x3f80000000000000;
  (dst->at).x = 0.0;
  (dst->at).y = 0.0;
  *(undefined8 *)&(dst->at).z = 0x3f800000;
  (dst->up).x = 0.0;
  (dst->up).y = 1.0;
  *(undefined8 *)&(dst->up).z = 0;
  (dst->right).x = 1.0;
  (dst->right).y = 0.0;
  *(undefined8 *)&(dst->right).z = 0;
  return;
}

Assistant:

void
RawMatrix::setIdentity(RawMatrix *dst)
{
	static RawMatrix identity = {
		{ 1.0f, 0.0f, 0.0f }, 0.0f,
		{ 0.0f, 1.0f, 0.0f }, 0.0f,
		{ 0.0f, 0.0f, 1.0f }, 0.0f,
		{ 0.0f, 0.0f, 0.0f }, 1.0f
	};
	*dst = identity;
}